

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabText.h
# Opt level: O1

char * tsGetTokenAlphaNumericExt
                 (char *pCurr,char *pEnd,char *ext_,char **resultStringBegin,uint32_t *stringLength)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  
  pbVar2 = (byte *)pCurr;
  if (pCurr < pEnd) {
    do {
      pCurr = (char *)pbVar2;
      if ((0x20 < (ulong)(byte)*pCurr) || ((0x100002600U >> ((ulong)(byte)*pCurr & 0x3f) & 1) == 0))
      break;
      pbVar2 = (byte *)pCurr + 1;
      pCurr = pEnd;
    } while (pbVar2 != (byte *)pEnd);
  }
  *resultStringBegin = pCurr;
  *stringLength = 0;
  do {
    if (pEnd <= pCurr) {
      return (char *)(byte *)pCurr;
    }
    bVar1 = *pCurr;
    if (((ulong)bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
LAB_001134f1:
      bVar3 = false;
    }
    else {
      bVar5 = (byte)(bVar1 - 0x30) < 10;
      bVar6 = (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a;
      bVar3 = bVar6 || bVar5;
      bVar4 = *ext_;
      if ((bVar4 != 0) && (pbVar2 = (byte *)(ext_ + 1), !bVar6 && !bVar5)) {
        do {
          bVar3 = (bool)(bVar4 == bVar1 | bVar3);
          bVar4 = *pbVar2;
          if (bVar4 == 0) break;
          pbVar2 = pbVar2 + 1;
        } while (!bVar3);
      }
      if (!bVar3) goto LAB_001134f1;
      pCurr = (char *)((byte *)pCurr + 1);
      *stringLength = *stringLength + 1;
      bVar3 = true;
    }
    if (!bVar3) {
      return (char *)(byte *)pCurr;
    }
  } while( true );
}

Assistant:

char const* tsGetTokenAlphaNumericExt(
    char const* pCurr, char const* pEnd,
    char const* ext_,
    char const** resultStringBegin, uint32_t* stringLength)
{
    Assert(pCurr && pEnd);

    pCurr = tsScanForNonWhiteSpace(pCurr, pEnd);
    *resultStringBegin = pCurr;
    *stringLength = 0;

    while (pCurr < pEnd)
    {
        char test = pCurr[0];

        if (tsIsWhiteSpace(test))
            break;

        _Bool accept = tsIsNumeric(test) || tsIsAlpha(test);
        char const* ext = ext_;
        for ( ; *ext && !accept; ++ext)
            accept |= *ext == test;

        if (!accept)
            break;

        ++pCurr;
        *stringLength += 1;
    }

    return pCurr;
}